

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2::
~TestParsingMergeLite_RepeatedFieldsGenerator_Group2
          (TestParsingMergeLite_RepeatedFieldsGenerator_Group2 *this)

{
  TestParsingMergeLite_RepeatedFieldsGenerator_Group2 *this_local;
  
  ~TestParsingMergeLite_RepeatedFieldsGenerator_Group2(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestParsingMergeLite_RepeatedFieldsGenerator_Group2::~TestParsingMergeLite_RepeatedFieldsGenerator_Group2() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator.Group2)
  SharedDtor(*this);
}